

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

QNetworkRequest __thiscall
QNetworkAccessManagerPrivate::prepareMultipart
          (QNetworkAccessManagerPrivate *this,QNetworkRequest *request,QHttpMultiPart *multiPart)

{
  long *plVar1;
  QAnyStringView value;
  QAnyStringView value_00;
  bool bVar2;
  char cVar3;
  uint uVar4;
  long in_RCX;
  char *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  char *local_50;
  QHttpHeaders h;
  QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)this,(QNetworkRequest *)multiPart);
  h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::headers((QNetworkRequest *)&h);
  bVar2 = QHttpHeaders::contains(&h,ContentType);
  if (!bVar2) {
    local_68.size._0_4_ = 0;
    local_68.size._4_4_ = 0;
    local_68.d._0_4_ = 0;
    local_68.d._4_4_ = 0;
    local_68.ptr._0_4_ = 0;
    local_68.ptr._4_4_ = 0;
    QByteArray::reserve((QByteArray *)&local_68,*(long *)(*(long *)(in_RCX + 8) + 0xa0) + 0x22);
    QByteArray::append((QByteArray *)&local_68,"multipart/");
    uVar4 = *(int *)(*(long *)(in_RCX + 8) + 0xa8) - 1;
    if (uVar4 < 3) {
      pcVar5 = &DAT_0023dd10 + *(int *)(&DAT_0023dd10 + (ulong)uVar4 * 4);
    }
    else {
      pcVar5 = "mixed";
    }
    QByteArray::append((QByteArray *)&local_68,pcVar5);
    local_40.a.b = (QByteArray *)(*(long *)(in_RCX + 8) + 0x90);
    local_40.a.a = (char (*) [13])0x23ded7;
    local_40.b = '\"';
    ::operator+=((QByteArray *)&local_68,&local_40);
    value.field_0._4_4_ = local_68.ptr._4_4_;
    value.field_0._0_4_ = local_68.ptr._0_4_;
    value.m_size._0_4_ = (undefined4)local_68.size;
    value.m_size._4_4_ = local_68.size._4_4_;
    QHttpHeaders::append(&h,ContentType,value);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  }
  bVar2 = QHttpHeaders::contains(&h,MIMEVersion);
  if (!bVar2) {
    Qt::Literals::StringLiterals::operator____ba((QByteArray *)&local_68,"1.0",3);
    value_00.field_0._4_4_ = local_68.ptr._4_4_;
    value_00.field_0._0_4_ = local_68.ptr._0_4_;
    value_00.m_size._0_4_ = (undefined4)local_68.size;
    value_00.m_size._4_4_ = local_68.size._4_4_;
    QHttpHeaders::append(&h,MIMEVersion,value_00);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  }
  QNetworkRequest::setHeaders((QNetworkRequest *)this,&h);
  plVar1 = *(long **)(*(long *)(in_RCX + 8) + 0xb0);
  cVar3 = QIODevice::isReadable();
  if (cVar3 == '\0') {
    cVar3 = QIODevice::isOpen();
    if (cVar3 == '\0') {
      cVar3 = (**(code **)(*plVar1 + 0x68))(plVar1,1);
      if (cVar3 != '\0') goto LAB_00178128;
      pcVar5 = "could not open device for reading";
    }
    else {
      pcVar5 = "device is not readable";
    }
    local_50 = "default";
    local_68.size._4_4_ = 0;
    local_68.size._0_4_ = 0;
    local_68.ptr._4_4_ = 0;
    local_68.ptr._0_4_ = 0;
    local_68.d._4_4_ = 0;
    local_68.d._0_4_ = 2;
    QMessageLogger::warning((char *)&local_68,pcVar5);
  }
LAB_00178128:
  QHttpHeaders::~QHttpHeaders(&h);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSharedDataPointer<QNetworkRequestPrivate>)
           (QSharedDataPointer<QNetworkRequestPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkRequest QNetworkAccessManagerPrivate::prepareMultipart(const QNetworkRequest &request, QHttpMultiPart *multiPart)
{
    // copy the request, we probably need to add some headers
    QNetworkRequest newRequest(request);
    auto h = newRequest.headers();

    // add Content-Type header if not there already
    if (!h.contains(QHttpHeaders::WellKnownHeader::ContentType)) {
        QByteArray contentType;
        contentType.reserve(34 + multiPart->d_func()->boundary.size());
        contentType += "multipart/";
        switch (multiPart->d_func()->contentType) {
        case QHttpMultiPart::RelatedType:
            contentType += "related";
            break;
        case QHttpMultiPart::FormDataType:
            contentType += "form-data";
            break;
        case QHttpMultiPart::AlternativeType:
            contentType += "alternative";
            break;
        default:
            contentType += "mixed";
            break;
        }
        // putting the boundary into quotes, recommended in RFC 2046 section 5.1.1
        contentType += "; boundary=\"" + multiPart->d_func()->boundary + '"';
        h.append(QHttpHeaders::WellKnownHeader::ContentType, contentType);
    }

    // add MIME-Version header if not there already (we must include the header
    // if the message conforms to RFC 2045, see section 4 of that RFC)
    if (!h.contains(QHttpHeaders::WellKnownHeader::MIMEVersion))
        h.append(QHttpHeaders::WellKnownHeader::MIMEVersion, "1.0"_ba);

    newRequest.setHeaders(std::move(h));

    QIODevice *device = multiPart->d_func()->device;
    if (!device->isReadable()) {
        if (!device->isOpen()) {
            if (!device->open(QIODevice::ReadOnly))
                qWarning("could not open device for reading");
        } else {
            qWarning("device is not readable");
        }
    }

    return newRequest;
}